

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGeneratorFactory.h
# Opt level: O3

unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_> __thiscall
cmGlobalGeneratorSimpleFactory<cmGlobalNinjaGenerator>::CreateGlobalGenerator
          (cmGlobalGeneratorSimpleFactory<cmGlobalNinjaGenerator> *this,string *name,bool param_2,
          cmake *cm)

{
  cmGlobalNinjaGenerator *this_00;
  undefined7 in_register_00000011;
  cmake *in_R8;
  
  if ((*(long *)(CONCAT71(in_register_00000011,param_2) + 8) == 5) &&
     ((char)(*(int **)CONCAT71(in_register_00000011,param_2))[1] == 'a' &&
      **(int **)CONCAT71(in_register_00000011,param_2) == 0x6a6e694e)) {
    this_00 = (cmGlobalNinjaGenerator *)operator_new(0xaf8);
    cmGlobalNinjaGenerator::cmGlobalNinjaGenerator(this_00,in_R8);
  }
  else {
    this_00 = (cmGlobalNinjaGenerator *)0x0;
  }
  (this->super_cmGlobalGeneratorFactory)._vptr_cmGlobalGeneratorFactory = (_func_int **)this_00;
  return (__uniq_ptr_data<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>,_true,_true>)
         (__uniq_ptr_data<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>,_true,_true>)
         this;
}

Assistant:

std::unique_ptr<cmGlobalGenerator> CreateGlobalGenerator(
    const std::string& name, bool /*allowArch*/, cmake* cm) const override
  {
    if (name != T::GetActualName()) {
      return std::unique_ptr<cmGlobalGenerator>();
    }
    return std::unique_ptr<cmGlobalGenerator>(cm::make_unique<T>(cm));
  }